

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> __thiscall
wallet::CWallet::GetSolvingProvider(CWallet *this,CScript *script)

{
  _Base_ptr p_Var1;
  SignatureData *in_RDX;
  long in_FS_OFFSET;
  SignatureData sigdata;
  SignatureData local_3c0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c0.complete = false;
  local_3c0.witness = false;
  p_Var1 = &local_3c0.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c0.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c0.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&local_3c0.scriptSig,0,0xb8);
  local_3c0.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c0.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  local_3c0.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c0.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c0.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c0.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3c0.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c0.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c0.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c0.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c0.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3c0.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c0.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c0.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c0.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c0.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c0.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c0.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c0.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c0.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c0.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c0.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c0.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c0.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c0.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c0.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c0.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c0.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c0.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3c0.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c0.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c0.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c0.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_3c0.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_3c0.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  local_3c0.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_3c0.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c0.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c0.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c0.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c0.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c0.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c0.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c0.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c0.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c0.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c0.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c0.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c0.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c0.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c0.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c0.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c0.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c0.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c0.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c0.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c0.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c0.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c0.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var1;
  local_3c0.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var1;
  local_3c0.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c0.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c0.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c0.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c0.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c0.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c0.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c0.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c0.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c0.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c0.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c0.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c0.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c0.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c0.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c0.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c0.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c0.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  GetSolvingProvider(this,script,in_RDX);
  SignatureData::~SignatureData(&local_3c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<SigningProvider,_std::default_delete<SigningProvider>,_true,_true>)
           (__uniq_ptr_data<SigningProvider,_std::default_delete<SigningProvider>,_true,_true>)this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<SigningProvider> CWallet::GetSolvingProvider(const CScript& script) const
{
    SignatureData sigdata;
    return GetSolvingProvider(script, sigdata);
}